

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O3

void __thiscall
Js::StringProfiler::RecordConcatenation
          (StringProfiler *this,uint lenLeft,uint lenRight,ConcatType type)

{
  bool bVar1;
  ThreadContextId pvVar2;
  ConcatMetrics **index;
  UintUintPair local_48;
  UintUintPair key;
  ConcatMetrics *metrics;
  int i;
  
  pvVar2 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar2 != this->mainThreadId) {
    return;
  }
  local_48.first = lenLeft;
  if (0x13 < lenLeft) {
    local_48.first = 0x14;
  }
  local_48.second = 0x14;
  if (lenRight < 0x14) {
    local_48.second = lenRight;
  }
  index = &metrics;
  bVar1 = JsUtil::
          BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<Js::StringProfiler::UintUintPair>
                    (&this->stringConcatMetrics,&local_48,(ConcatMetrics **)&key,(int *)index);
  if (bVar1) {
    switch(type) {
    case ConcatType_Unknown:
      key = (UintUintPair)((long)key + 0xc);
      break;
    case ConcatType_CompoundString:
      break;
    case ConcatType_ConcatTree:
      key = (UintUintPair)((long)key + 4);
      break;
    case ConcatType_BufferString:
      key = (UintUintPair)((long)key + 8);
      break;
    default:
      return;
    }
    *(int *)key = *(int *)key + 1;
    return;
  }
  metrics = (ConcatMetrics *)0x0;
  _i = (ConcatMetrics *)0x0;
  switch(type) {
  case ConcatType_Unknown:
    index = (ConcatMetrics **)&stack0xffffffffffffffd4;
    break;
  case ConcatType_CompoundString:
    break;
  case ConcatType_ConcatTree:
    index = (ConcatMetrics **)((long)&metrics + 4);
    break;
  case ConcatType_BufferString:
    index = (ConcatMetrics **)&i;
    break;
  default:
    goto switchD_00d38177_default;
  }
  *(int *)index = *(int *)index + 1;
switchD_00d38177_default:
  JsUtil::
  BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::StringProfiler::UintUintPair,Js::StringProfiler::ConcatMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->stringConcatMetrics,&local_48,(ConcatMetrics *)&metrics);
  return;
}

Assistant:

void StringProfiler::RecordConcatenation( uint lenLeft, uint lenRight, ConcatType type )
    {
        if( IsOnWrongThread() )
        {
            return;
        }

        lenLeft = min( lenLeft, k_MaxConcatLength );
        lenRight = min( lenRight, k_MaxConcatLength );

        UintUintPair key = { lenLeft, lenRight };
        ConcatMetrics* metrics;
        if(!stringConcatMetrics.TryGetReference(key, &metrics))
        {
            stringConcatMetrics.Add(key, ConcatMetrics(type));
        }
        else
        {
            metrics->Accumulate(type);
        }
    }